

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int array_container_get_index(array_container_t *arr,uint16_t x)

{
  int32_t iVar1;
  
  iVar1 = binarySearch(arr->array,arr->cardinality,x);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

inline int array_container_get_index(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx;
    } else {
        return -1;
    }
}